

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O3

void __thiscall
QDnsLookup::setNameserver(QDnsLookup *this,Protocol protocol,QHostAddress *nameserver,quint16 port)

{
  Qt::beginPropertyUpdateGroup();
  QObjectBindableProperty<QDnsLookupPrivate,_QHostAddress,_&QDnsLookupPrivate::_qt_property_nameserver_offset,_&QDnsLookupPrivate::nameserverChanged>
  ::setValue((QObjectBindableProperty<QDnsLookupPrivate,_QHostAddress,_&QDnsLookupPrivate::_qt_property_nameserver_offset,_&QDnsLookupPrivate::nameserverChanged>
              *)(*(long *)&this->field_0x8 + 0x90),nameserver);
  QObjectBindableProperty<QDnsLookupPrivate,_unsigned_short,_&QDnsLookupPrivate::_qt_property_port_offset,_&QDnsLookupPrivate::nameserverPortChanged>
  ::setValue((QObjectBindableProperty<QDnsLookupPrivate,_unsigned_short,_&QDnsLookupPrivate::_qt_property_port_offset,_&QDnsLookupPrivate::nameserverPortChanged>
              *)(*(long *)&this->field_0x8 + 0x9c),port);
  QObjectBindableProperty<QDnsLookupPrivate,_QDnsLookup::Protocol,_&QDnsLookupPrivate::_qt_property_protocol_offset,_&QDnsLookupPrivate::nameserverProtocolChanged>
  ::setValue((QObjectBindableProperty<QDnsLookupPrivate,_QDnsLookup::Protocol,_&QDnsLookupPrivate::_qt_property_protocol_offset,_&QDnsLookupPrivate::nameserverProtocolChanged>
              *)(*(long *)&this->field_0x8 + 0x9e),protocol);
  Qt::endPropertyUpdateGroup();
  return;
}

Assistant:

void QDnsLookup::setNameserver(Protocol protocol, const QHostAddress &nameserver, quint16 port)
{
    Qt::beginPropertyUpdateGroup();
    setNameserver(nameserver);
    setNameserverPort(port);
    setNameserverProtocol(protocol);
    Qt::endPropertyUpdateGroup();
}